

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_enrich2(REF_GRID ref_grid)

{
  REF_MPI pRVar1;
  REF_NODE ref_node;
  bool bVar2;
  REF_EDGE pRVar3;
  uint uVar4;
  REF_STATUS RVar5;
  void *__ptr;
  long lVar6;
  REF_INT RVar7;
  REF_CELL pRVar8;
  char *pcVar9;
  int iVar10;
  REF_EDGE ref_edge;
  REF_INT new_cell;
  REF_INT node;
  REF_INT part;
  REF_INT nodes [27];
  REF_GLOB global;
  REF_INT local_c4;
  REF_EDGE local_c0;
  REF_INT local_b4;
  REF_INT local_b0;
  int local_ac;
  REF_INT local_a8 [4];
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  REF_GLOB local_38;
  
  pRVar1 = ref_grid->mpi;
  ref_node = ref_grid->node;
  uVar4 = ref_node_synchronize_globals(ref_node);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xfaf,
           "ref_geom_enrich2",(ulong)uVar4,"sync glob");
    return uVar4;
  }
  uVar4 = ref_geom_constrain_all(ref_grid);
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xfb1,
           "ref_geom_enrich2",(ulong)uVar4,"constrain");
    return uVar4;
  }
  uVar4 = ref_edge_create(&local_c0,ref_grid);
  pRVar3 = local_c0;
  if (uVar4 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xfb3,
           "ref_geom_enrich2",(ulong)uVar4,"edge");
    return uVar4;
  }
  if ((long)local_c0->n < 0) {
    uVar4 = 1;
    pcVar9 = "malloc edge_node of REF_INT negative";
  }
  else {
    __ptr = malloc((long)local_c0->n << 2);
    if (__ptr != (void *)0x0) {
      bVar2 = true;
      uVar4 = 0;
      if (0 < pRVar3->n) {
        lVar6 = 0;
        do {
          *(undefined4 *)((long)__ptr + lVar6 * 4) = 0xffffffff;
          lVar6 = lVar6 + 1;
        } while (lVar6 < pRVar3->n);
      }
      goto LAB_0015ec88;
    }
    uVar4 = 2;
    pcVar9 = "malloc edge_node of REF_INT NULL";
  }
  bVar2 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xfb4,
         "ref_geom_enrich2",pcVar9);
  __ptr = (void *)0x0;
LAB_0015ec88:
  if (bVar2) {
    local_c4 = 0;
    if (0 < local_c0->n) {
      do {
        uVar4 = ref_edge_part(local_c0,local_c4,&local_ac);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xfb6,"ref_geom_enrich2",(ulong)uVar4,"edge part");
          return uVar4;
        }
        if (pRVar1->id == local_ac) {
          uVar4 = ref_node_next_global(ref_node,&local_38);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xfb8,"ref_geom_enrich2",(ulong)uVar4,"next global");
            return uVar4;
          }
          uVar4 = ref_node_add(ref_node,local_38,&local_b0);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xfb9,"ref_geom_enrich2",(ulong)uVar4,"add node");
            return uVar4;
          }
          *(REF_INT *)((long)__ptr + (long)local_c4 * 4) = local_b0;
          uVar4 = ref_node_interpolate_edge
                            (ref_node,local_c0->e2n[(long)local_c4 * 2],
                             local_c0->e2n[local_c4 * 2 + 1],0.5,local_b0);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xfbd,"ref_geom_enrich2",(ulong)uVar4,"new reals");
            return uVar4;
          }
          uVar4 = ref_geom_add_constrain_midnode
                            (ref_grid,local_c0->e2n[(long)local_c4 * 2],
                             local_c0->e2n[local_c4 * 2 + 1],0.5,local_b0);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xfc1,"ref_geom_enrich2",(ulong)uVar4,"new geom");
            return uVar4;
          }
        }
        local_c4 = local_c4 + 1;
      } while (local_c4 < local_c0->n);
    }
    uVar4 = ref_node_shift_new_globals(ref_node);
    if (uVar4 == 0) {
      pRVar8 = ref_grid->cell[0];
      if (0 < pRVar8->max) {
        iVar10 = 0;
        do {
          RVar5 = ref_cell_nodes(pRVar8,iVar10,local_a8);
          if (RVar5 == 0) {
            local_a8[ref_grid->cell[1]->node_per] = local_a8[ref_grid->cell[0]->node_per];
            uVar4 = ref_edge_with(local_c0,local_a8[0],local_a8[1],&local_c4);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xfca,"ref_geom_enrich2",(ulong)uVar4,"find edge01");
              return uVar4;
            }
            local_a8[2] = *(REF_INT *)((long)__ptr + (long)local_c4 * 4);
            uVar4 = ref_cell_add(ref_grid->cell[1],local_a8,&local_b4);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xfcc,"ref_geom_enrich2",(ulong)uVar4,"add");
              return uVar4;
            }
          }
          iVar10 = iVar10 + 1;
          pRVar8 = ref_grid->cell[0];
        } while (iVar10 < pRVar8->max);
      }
      pRVar8 = ref_grid->cell[3];
      if (0 < pRVar8->max) {
        RVar7 = 0;
        do {
          RVar5 = ref_cell_nodes(pRVar8,RVar7,local_a8);
          if (RVar5 == 0) {
            local_a8[ref_grid->cell[4]->node_per] = local_a8[ref_grid->cell[3]->node_per];
            uVar4 = ref_edge_with(local_c0,local_a8[0],local_a8[1],&local_c4);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xfd2,"ref_geom_enrich2",(ulong)uVar4,"find edge01");
              return uVar4;
            }
            local_a8[3] = *(REF_INT *)((long)__ptr + (long)local_c4 * 4);
            uVar4 = ref_edge_with(local_c0,local_a8[1],local_a8[2],&local_c4);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xfd4,"ref_geom_enrich2",(ulong)uVar4,"find edge12");
              return uVar4;
            }
            local_98 = *(undefined4 *)((long)__ptr + (long)local_c4 * 4);
            uVar4 = ref_edge_with(local_c0,local_a8[2],local_a8[0],&local_c4);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xfd6,"ref_geom_enrich2",(ulong)uVar4,"find edge20");
              return uVar4;
            }
            local_94 = *(undefined4 *)((long)__ptr + (long)local_c4 * 4);
            uVar4 = ref_cell_add(ref_grid->cell[4],local_a8,&local_b4);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xfd8,"ref_geom_enrich2",(ulong)uVar4,"add");
              return uVar4;
            }
          }
          RVar7 = RVar7 + 1;
          pRVar8 = ref_grid->cell[3];
        } while (RVar7 < pRVar8->max);
      }
      pRVar8 = ref_grid->cell[8];
      if (0 < pRVar8->max) {
        iVar10 = 0;
        do {
          RVar5 = ref_cell_nodes(pRVar8,iVar10,local_a8);
          if (RVar5 == 0) {
            uVar4 = ref_edge_with(local_c0,local_a8[0],local_a8[1],&local_c4);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xfdb,"ref_geom_enrich2",(ulong)uVar4,"find edge");
              return uVar4;
            }
            local_98 = *(undefined4 *)((long)__ptr + (long)local_c4 * 4);
            uVar4 = ref_edge_with(local_c0,local_a8[1],local_a8[2],&local_c4);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xfdd,"ref_geom_enrich2",(ulong)uVar4,"find edge");
              return uVar4;
            }
            local_94 = *(undefined4 *)((long)__ptr + (long)local_c4 * 4);
            uVar4 = ref_edge_with(local_c0,local_a8[0],local_a8[2],&local_c4);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xfdf,"ref_geom_enrich2",(ulong)uVar4,"find edge");
              return uVar4;
            }
            local_90 = *(undefined4 *)((long)__ptr + (long)local_c4 * 4);
            uVar4 = ref_edge_with(local_c0,local_a8[0],local_a8[3],&local_c4);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xfe1,"ref_geom_enrich2",(ulong)uVar4,"find edge");
              return uVar4;
            }
            local_8c = *(undefined4 *)((long)__ptr + (long)local_c4 * 4);
            uVar4 = ref_edge_with(local_c0,local_a8[1],local_a8[3],&local_c4);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xfe3,"ref_geom_enrich2",(ulong)uVar4,"find edge");
              return uVar4;
            }
            local_88 = *(undefined4 *)((long)__ptr + (long)local_c4 * 4);
            uVar4 = ref_edge_with(local_c0,local_a8[2],local_a8[3],&local_c4);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xfe5,"ref_geom_enrich2",(ulong)uVar4,"find edge");
              return uVar4;
            }
            local_84 = *(undefined4 *)((long)__ptr + (long)local_c4 * 4);
            uVar4 = ref_cell_add(ref_grid->cell[0xc],local_a8,&local_b4);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xfe7,"ref_geom_enrich2",(ulong)uVar4,"add");
              return uVar4;
            }
          }
          iVar10 = iVar10 + 1;
          pRVar8 = ref_grid->cell[8];
        } while (iVar10 < pRVar8->max);
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      uVar4 = ref_edge_free(local_c0);
      if (uVar4 == 0) {
        pRVar8 = ref_grid->cell[0];
        if (0 < pRVar8->max) {
          RVar7 = 0;
          do {
            if (pRVar8->c2n[(long)RVar7 * (long)pRVar8->size_per] != -1) {
              ref_cell_remove(pRVar8,RVar7);
            }
            RVar7 = RVar7 + 1;
            pRVar8 = ref_grid->cell[0];
          } while (RVar7 < pRVar8->max);
        }
        pRVar8 = ref_grid->cell[3];
        if (0 < pRVar8->max) {
          iVar10 = 0;
          do {
            if (pRVar8->c2n[(long)iVar10 * (long)pRVar8->size_per] != -1) {
              ref_cell_remove(pRVar8,iVar10);
            }
            iVar10 = iVar10 + 1;
            pRVar8 = ref_grid->cell[3];
          } while (iVar10 < pRVar8->max);
        }
        pRVar8 = ref_grid->cell[8];
        if (pRVar8->max < 1) {
          uVar4 = 0;
        }
        else {
          iVar10 = 0;
          uVar4 = 0;
          do {
            if (pRVar8->c2n[(long)iVar10 * (long)pRVar8->size_per] != -1) {
              ref_cell_remove(pRVar8,iVar10);
            }
            iVar10 = iVar10 + 1;
            pRVar8 = ref_grid->cell[8];
          } while (iVar10 < pRVar8->max);
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xfeb,"ref_geom_enrich2",(ulong)uVar4,"free edge");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xfc5,
             "ref_geom_enrich2",(ulong)uVar4,"shift glob");
    }
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_geom_enrich2(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge, *edge_node, part, node;
  REF_GLOB global;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell, new_cell;

  RSS(ref_node_synchronize_globals(ref_node), "sync glob");

  RSS(ref_geom_constrain_all(ref_grid), "constrain");

  RSS(ref_edge_create(&ref_edge, ref_grid), "edge");
  ref_malloc_init(edge_node, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (ref_mpi_rank(ref_mpi) == part) {
      RSS(ref_node_next_global(ref_node, &global), "next global");
      RSS(ref_node_add(ref_node, global, &node), "add node");
      edge_node[edge] = node;
      RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                    ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
          "new reals");
      RSS(ref_geom_add_constrain_midnode(
              ref_grid, ref_edge_e2n(ref_edge, 0, edge),
              ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
          "new geom");
    }
  }

  RSS(ref_node_shift_new_globals(ref_node), "shift glob");

  each_ref_cell_valid_cell_with_nodes(ref_grid_edg(ref_grid), cell, nodes) {
    nodes[ref_cell_id_index(ref_grid_ed2(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_edg(ref_grid))];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge01");
    nodes[2] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_ed2(ref_grid), nodes, &new_cell), "add");
  }

  each_ref_cell_valid_cell_with_nodes(ref_grid_tri(ref_grid), cell, nodes) {
    nodes[ref_cell_id_index(ref_grid_tr2(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_tri(ref_grid))];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge01");
    nodes[3] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge12");
    nodes[4] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge), "find edge20");
    nodes[5] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_tr2(ref_grid), nodes, &new_cell), "add");
  }
  each_ref_cell_valid_cell_with_nodes(ref_grid_tet(ref_grid), cell, nodes) {
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge");
    nodes[4] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge");
    nodes[5] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[2], &edge), "find edge");
    nodes[6] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[3], &edge), "find edge");
    nodes[7] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[3], &edge), "find edge");
    nodes[8] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[3], &edge), "find edge");
    nodes[9] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_te2(ref_grid), nodes, &new_cell), "add");
  }

  ref_free(edge_node);
  RSS(ref_edge_free(ref_edge), "free edge");

  each_ref_cell_valid_cell(ref_grid_edg(ref_grid), cell) {
    ref_cell_remove(ref_grid_edg(ref_grid), cell);
  }
  each_ref_cell_valid_cell(ref_grid_tri(ref_grid), cell) {
    ref_cell_remove(ref_grid_tri(ref_grid), cell);
  }
  each_ref_cell_valid_cell(ref_grid_tet(ref_grid), cell) {
    ref_cell_remove(ref_grid_tet(ref_grid), cell);
  }

  return REF_SUCCESS;
}